

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O0

void DeviceAmstradCPC464(CDevice **dev,CDevice *parent,aint ramtop)

{
  CDevice *this;
  int local_48 [2];
  int initialPages [4];
  aint ramtop_local;
  CDevice *parent_local;
  CDevice **dev_local;
  
  if (ramtop != 0) {
    WarningById(W_NO_RAMTOP,(char *)0x0,W_PASS3);
  }
  this = (CDevice *)operator_new(0x2838);
  CDevice::CDevice(this,"AMSTRADCPC464",parent);
  *dev = this;
  local_48[0] = 0;
  local_48[1] = 1;
  initialPages[0] = 2;
  initialPages[1] = 3;
  initRegularSlotDevice(*dev,0x4000,4,4,local_48);
  return;
}

Assistant:

static void DeviceAmstradCPC464(CDevice** dev, CDevice* parent, aint ramtop) {
	if (ramtop) WarningById(W_NO_RAMTOP);
	*dev = new CDevice("AMSTRADCPC464", parent);
	const int initialPages[] = { 0, 1, 2, 3 };
	initRegularSlotDevice(*dev, 0x4000, 4, 4, initialPages);
}